

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O1

istream * spvtools::utils::operator>>
                    (istream *is,
                    HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
                    *value)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  istream *piVar6;
  ulong uVar7;
  void *pvVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  char cVar13;
  short sVar14;
  byte bVar15;
  ushort uVar16;
  short sVar17;
  bool bVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  bool bVar22;
  HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
  float_val;
  float float_val_1;
  uint local_74;
  istream *local_70;
  istream *local_68;
  undefined4 local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  int local_4c;
  ulong local_48;
  HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
  *local_40;
  uint local_34;
  
  (value->value_).data_ = 0;
  if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x19] & 0x10) != 0) {
    while( true ) {
      iVar1 = std::istream::peek();
      iVar1 = isspace(iVar1);
      if (iVar1 == 0) break;
      std::istream::get();
    }
  }
  iVar1 = std::istream::peek();
  if ((iVar1 == 0x2d) || (iVar1 == 0x30)) {
    iVar2 = iVar1;
    if (iVar1 == 0x2d) {
      std::istream::get();
      iVar2 = std::istream::peek();
    }
    if (iVar2 != 0x30) {
      piVar6 = ParseNormalFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>>>
                         (is,iVar1 == 0x2d,value);
      return piVar6;
    }
    std::istream::get();
    uVar3 = std::istream::peek();
    if ((uVar3 & 0xffffffdf) == 0x58) {
      std::istream::get();
      uVar3 = std::istream::peek();
      local_40 = value;
      local_4c = iVar1;
      while (uVar3 == 0x30) {
        std::istream::get();
        uVar3 = std::istream::peek();
      }
      uVar11 = CONCAT62((uint6)(ushort)((uint)iVar1 >> 0x10),0xf);
      uVar10 = 0;
      uVar7 = 0;
      local_50 = 0;
      local_54 = 0;
      uVar19 = 0;
      local_60 = 0;
      local_70 = is;
      do {
        if (uVar3 == 0x2e) {
          uVar7 = CONCAT71((int7)(uVar7 >> 8),1);
        }
        else if (uVar3 == 0x70) {
          uVar10 = 1;
        }
        else {
          local_58 = (uint)uVar10;
          iVar1 = isxdigit(uVar3);
          if (iVar1 == 0) goto LAB_0062131f;
          pvVar8 = memchr("0123456789",uVar3,0xb);
          local_5c = (uint)uVar7;
          if (pvVar8 == (void *)0x0) {
            cVar13 = -0x7f;
            pvVar8 = memchr("abcdef",uVar3,7);
            if (pvVar8 == (void *)0x0) {
              cVar13 = -0x78;
              pvVar8 = memchr("ABCDEF",uVar3,7);
              if (pvVar8 == (void *)0x0) goto LAB_00621439;
            }
            bVar15 = ((char)pvVar8 - cVar13) + 10;
          }
          else {
            bVar15 = (char)pvVar8 + 1;
          }
          uVar21 = (uint)bVar15;
          bVar22 = false;
          uVar3 = 0;
          uVar10 = uVar11;
          do {
            piVar6 = local_70;
            uVar4 = uVar21 >> 3 & 1;
            if (uVar19 == 0) {
LAB_0062103b:
              uVar11 = uVar10;
              uVar19 = (ulong)(byte)((byte)uVar19 | (byte)uVar4);
              uVar7 = 1;
            }
            else {
              uVar5 = uVar4 << (0xfU - (char)local_60 & 0x1f);
              if ((short)uVar4 == 0) {
                uVar5 = 0;
              }
              if (0xf < (ushort)local_60) {
                uVar5 = 0;
              }
              local_50 = local_50 | uVar5;
              sVar14 = (ushort)local_60 + 1;
              local_60 = CONCAT22((short)((uint)local_60 >> 0x10),sVar14);
              if (sVar14 == 0) {
                local_60 = 0xffff;
              }
              uVar11 = uVar10 & 0xffff;
              uVar10 = (ulong)((int)uVar10 + 1);
              if ((int)uVar11 != 0x7fff) goto LAB_0062103b;
              std::ios::clear((int)local_70 + (int)*(undefined8 *)(*(long *)local_70 + -0x18));
              uVar7 = 0;
              local_68 = piVar6;
            }
            if ((char)uVar7 == '\0') break;
            uVar21 = uVar21 * 2;
            bVar22 = 2 < uVar3;
            uVar3 = uVar3 + 1;
            uVar7 = (ulong)uVar3;
            uVar10 = uVar11;
          } while (uVar3 != 4);
          local_54 = (uint)CONCAT71((int7)(uVar7 >> 8),1);
          uVar7 = (ulong)local_5c;
          uVar10 = (ulong)local_58;
          is = local_70;
          if (!bVar22) {
            return local_68;
          }
        }
        std::istream::get();
        uVar3 = std::istream::peek();
        uVar20 = uVar10;
      } while (((uVar10 & 1) == 0) && (uVar20 = uVar19, (uVar7 & 1) == 0));
      uVar7 = uVar7 ^ 1;
      if ((((byte)uVar7 | (byte)uVar10) & 1) == 0) {
        uVar21 = 0;
        local_5c = (uint)uVar7;
        do {
          if (uVar3 == 0x70) {
            uVar10 = CONCAT71((int7)(uVar20 >> 8),1);
          }
          else {
            local_58 = (uint)uVar10;
            iVar1 = isxdigit(uVar3);
            if (iVar1 == 0) goto LAB_0062131f;
            pvVar8 = memchr("0123456789",uVar3,0xb);
            if (pvVar8 == (void *)0x0) {
              cVar13 = -0x7f;
              pvVar8 = memchr("abcdef",uVar3,7);
              if (pvVar8 == (void *)0x0) {
                cVar13 = -0x78;
                pvVar8 = memchr("ABCDEF",uVar3,7);
                if (pvVar8 == (void *)0x0) {
LAB_00621439:
                  __assert_fail("false && \"This was called with a non-hex character\"",
                                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/util/hex_float.h"
                                ,0x2dd,"uint8_t spvtools::utils::get_nibble_from_character(int)");
                }
              }
              bVar15 = ((char)pvVar8 - cVar13) + 10;
            }
            else {
              bVar15 = (char)pvVar8 + 1;
            }
            uVar4 = (uint)bVar15;
            bVar22 = false;
            uVar3 = 0;
            do {
              piVar6 = local_70;
              uVar5 = uVar4 >> 3 & 1;
              uVar21 = uVar21 | uVar5;
              if (((local_54 & 1) == 0) && ((short)uVar21 == 0)) {
                uVar10 = uVar11 & 0xffff;
                bVar18 = true;
                uVar11 = (ulong)((int)uVar11 - 1);
                if ((int)uVar10 == 0x8000) {
                  local_48 = uVar10;
                  std::ios::clear((int)local_70 + (int)*(undefined8 *)(*(long *)local_70 + -0x18));
                  bVar18 = false;
                  local_68 = piVar6;
                  uVar11 = local_48;
                }
              }
              else {
                uVar12 = uVar5 << (0xfU - (char)local_60 & 0x1f);
                if ((short)uVar5 == 0) {
                  uVar12 = 0;
                }
                if (0xf < (ushort)local_60) {
                  uVar12 = 0;
                }
                local_50 = local_50 | uVar12;
                sVar14 = (ushort)local_60 + 1;
                local_60 = CONCAT22((short)((uint)local_60 >> 0x10),sVar14);
                if (sVar14 == 0) {
                  local_60 = 0xffff;
                }
                bVar18 = true;
              }
              if (!bVar18) break;
              uVar4 = uVar4 * 2;
              bVar22 = 2 < uVar3;
              uVar3 = uVar3 + 1;
            } while (uVar3 != 4);
            uVar7 = (ulong)local_5c;
            uVar10 = (ulong)local_58;
            is = local_70;
            if (!bVar22) {
              return local_68;
            }
          }
          std::istream::get();
          uVar3 = std::istream::peek();
          uVar20 = uVar10;
        } while ((((byte)uVar7 | (byte)uVar10) & 1) == 0);
      }
      bVar15 = 1;
      bVar18 = false;
      bVar22 = false;
      iVar1 = 0;
      local_48 = uVar11;
      do {
        is = local_70;
        if ((bVar22) || ((uVar3 != 0x2d && (uVar3 != 0x2b)))) {
          sVar14 = (short)iVar1;
          if (9 < uVar3 - 0x30) {
            if (bVar22) {
              sVar14 = sVar14 * (char)bVar15;
              iVar1 = (int)sVar14;
              sVar17 = (short)local_48;
              iVar2 = (int)local_48;
              if ((sVar14 < 0) || (sVar17 < 0)) {
                if ((sVar14 < 0) && (sVar17 < 0)) {
                  iVar9 = sVar17 + 0x7ffe;
                  uVar3 = 0x8002;
                  if (iVar9 != -iVar1 && SBORROW4(iVar9,-iVar1) == iVar9 + iVar1 < 0) {
                    uVar3 = iVar2 + iVar1;
                  }
                }
                else {
                  uVar3 = iVar1 + iVar2;
                }
              }
              else {
                uVar3 = iVar2 + iVar1;
                if (0x7ffe - sVar17 <= iVar1) {
                  uVar3 = 0x7ffe;
                }
              }
              bVar22 = (short)local_50 == 0;
              bVar15 = ~(byte)local_54 & bVar22;
              local_50 = local_50 << (~((byte)local_54 | bVar22) & 1);
              uVar21 = local_50 >> 1 | 0xffff8000;
              uVar4 = uVar3;
              if (bVar15 != 0) {
                uVar21 = local_50;
                uVar4 = 0;
              }
              if ((local_54 & 1) == 0 && !bVar22) {
                uVar4 = uVar3 - 1;
              }
              if (0 < (short)uVar4) {
                uVar21 = local_50;
              }
              uVar11 = ((ulong)uVar21 & 0xffff) >> 6;
              uVar16 = (ushort)uVar11;
              if (((short)uVar4 < 0) && (bVar15 == 0)) {
                bVar22 = false;
                do {
                  uVar16 = (ushort)(uVar11 >> 1);
                  uVar4 = uVar4 + 1;
                  if ((ushort)uVar11 < 2) {
                    bVar22 = true;
                    uVar4 = 0;
                  }
                } while (((short)uVar4 < 0) && (uVar11 = uVar11 >> 1, !bVar22));
              }
              uVar3 = 0x1f;
              if ((short)uVar4 < 0x1f) {
                uVar3 = uVar4;
              }
              if (0x1f < (short)uVar4) {
                uVar16 = 0;
              }
              (local_40->value_).data_ =
                   (ushort)((uVar3 & 0x1f) << 10) | (ushort)(local_4c == 0x2d) << 0xf | uVar16;
              return local_70;
            }
            goto LAB_0062131f;
          }
          iVar1 = iVar1 * 10 + (uVar3 & 0xf);
          if ((int)((ulong)(0x7ffe - (uVar3 & 0xf)) * 0x1999999a >> 0x20) <= (int)sVar14) {
            iVar1 = 0x7ffe;
          }
          bVar22 = true;
        }
        else {
          if (bVar18) goto LAB_0062131f;
          bVar15 = -(uVar3 == 0x2d) | 1;
          bVar18 = true;
        }
        std::istream::get();
        uVar3 = std::istream::peek();
      } while( true );
    }
    std::istream::unget();
    piVar6 = ParseNormalFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>>>
                       (is,iVar1 == 0x2d,value);
  }
  else {
    local_74 = 0;
    local_34 = 0;
    std::istream::_M_extract<float>((float *)is);
    local_74 = local_34;
    if ((local_34 & 0x7fffffff) == 0 && ((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 5) != 0)
    {
      local_74 = 0;
    }
    if ((local_34 & 0x7fffffff) == 0x7f800000) {
      local_74 = local_74 & 0x80000000 | 0x7f7fffff;
      std::ios::clear((int)is + (int)*(undefined8 *)(*(long *)is + -0x18));
    }
    HexFloat<spvtools::utils::FloatProxy<float>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>>>
    ::
    castTo<spvtools::utils::HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>>>>
              ((HexFloat<spvtools::utils::FloatProxy<float>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>>>
                *)&local_74,value,kToZero);
    uVar16 = (value->value_).data_;
    piVar6 = is;
    if ((uVar16 & 0x7fff) == 0x7c00) {
      (value->value_).data_ = uVar16 & 0x8000 | 0x7bff;
LAB_0062131f:
      std::ios::clear((int)is + (int)*(undefined8 *)(*(long *)is + -0x18));
      piVar6 = is;
    }
  }
  local_68 = piVar6;
  return local_68;
}

Assistant:

std::istream& operator>>(std::istream& is, HexFloat<T, Traits>& value) {
  using HF = HexFloat<T, Traits>;
  using uint_type = typename HF::uint_type;
  using int_type = typename HF::int_type;

  value.set_value(static_cast<typename HF::native_type>(0.f));

  if (is.flags() & std::ios::skipws) {
    // If the user wants to skip whitespace , then we should obey that.
    while (std::isspace(is.peek())) {
      is.get();
    }
  }

  auto next_char = is.peek();
  bool negate_value = false;

  if (next_char != '-' && next_char != '0') {
    return ParseNormalFloat(is, negate_value, value);
  }

  if (next_char == '-') {
    negate_value = true;
    is.get();
    next_char = is.peek();
  }

  if (next_char == '0') {
    is.get();  // We may have to unget this.
    auto maybe_hex_start = is.peek();
    if (maybe_hex_start != 'x' && maybe_hex_start != 'X') {
      is.unget();
      return ParseNormalFloat(is, negate_value, value);
    } else {
      is.get();  // Throw away the 'x';
    }
  } else {
    return ParseNormalFloat(is, negate_value, value);
  }

  // This "looks" like a hex-float so treat it as one.
  bool seen_p = false;
  bool seen_dot = false;

  // The mantissa bits, without the most significant 1 bit, and with the
  // the most recently read bits in the least significant positions.
  uint_type fraction = 0;
  // The number of mantissa bits that have been read, including the leading 1
  // bit that is not written into 'fraction'.
  uint_type fraction_index = 0;

  // TODO(dneto): handle overflow and underflow
  int_type exponent = HF::exponent_bias;

  // Strip off leading zeros so we don't have to special-case them later.
  while ((next_char = is.peek()) == '0') {
    is.get();
  }

  // Does the mantissa, as written, have non-zero digits to the left of
  // the decimal point.  Assume no until proven otherwise.
  bool has_integer_part = false;
  bool bits_written = false;  // Stays false until we write a bit.

  // Scan the mantissa hex digits until we see a '.' or the 'p' that
  // starts the exponent.
  while (!seen_p && !seen_dot) {
    // Handle characters that are left of the fractional part.
    if (next_char == '.') {
      seen_dot = true;
    } else if (next_char == 'p') {
      seen_p = true;
    } else if (::isxdigit(next_char)) {
      // We have stripped all leading zeroes and we have not yet seen a ".".
      has_integer_part = true;
      int number = get_nibble_from_character(next_char);
      for (int i = 0; i < 4; ++i, number <<= 1) {
        uint_type write_bit = (number & 0x8) ? 0x1 : 0x0;
        if (bits_written) {
          // If we are here the bits represented belong in the fractional
          // part of the float, and we have to adjust the exponent accordingly.
          fraction = detail::set_nth_most_significant_bit(fraction, write_bit,
                                                          fraction_index);
          // Increment the fraction index. If the input has bizarrely many
          // significant digits, then silently drop them.
          detail::saturated_inc(fraction_index);
          if (!detail::saturated_inc(exponent)) {
            // Overflow failure
            is.setstate(std::ios::failbit);
            return is;
          }
        }
        // Since this updated after setting fraction bits, this effectively
        // drops the leading 1 bit.
        bits_written |= write_bit != 0;
      }
    } else {
      // We have not found our exponent yet, so we have to fail.
      is.setstate(std::ios::failbit);
      return is;
    }
    is.get();
    next_char = is.peek();
  }

  // Finished reading the part preceding any '.' or 'p'.

  bits_written = false;
  while (seen_dot && !seen_p) {
    // Handle only fractional parts now.
    if (next_char == 'p') {
      seen_p = true;
    } else if (::isxdigit(next_char)) {
      int number = get_nibble_from_character(next_char);
      for (int i = 0; i < 4; ++i, number <<= 1) {
        uint_type write_bit = (number & 0x8) ? 0x01 : 0x00;
        bits_written |= write_bit != 0;
        if ((!has_integer_part) && !bits_written) {
          // Handle modifying the exponent here this way we can handle
          // an arbitrary number of hex values without overflowing our
          // integer.
          if (!detail::saturated_dec(exponent)) {
            // Overflow failure
            is.setstate(std::ios::failbit);
            return is;
          }
        } else {
          fraction = detail::set_nth_most_significant_bit(fraction, write_bit,
                                                          fraction_index);
          // Increment the fraction index. If the input has bizarrely many
          // significant digits, then silently drop them.
          detail::saturated_inc(fraction_index);
        }
      }
    } else {
      // We still have not found our 'p' exponent yet, so this is not a valid
      // hex-float.
      is.setstate(std::ios::failbit);
      return is;
    }
    is.get();
    next_char = is.peek();
  }

  // Finished reading the part preceding 'p'.
  // In hex floats syntax, the binary exponent is required.

  bool seen_exponent_sign = false;
  int8_t exponent_sign = 1;
  bool seen_written_exponent_digits = false;
  // The magnitude of the exponent, as written, or the sentinel value to signal
  // overflow.
  int_type written_exponent = 0;
  // A sentinel value signalling overflow of the magnitude of the written
  // exponent.  We'll assume that -written_exponent_overflow is valid for the
  // type. Later we may add 1 or subtract 1 from the adjusted exponent, so leave
  // room for an extra 1.
  const int_type written_exponent_overflow =
      std::numeric_limits<int_type>::max() - 1;
  while (true) {
    if (!seen_written_exponent_digits &&
        (next_char == '-' || next_char == '+')) {
      if (seen_exponent_sign) {
        is.setstate(std::ios::failbit);
        return is;
      }
      seen_exponent_sign = true;
      exponent_sign = (next_char == '-') ? -1 : 1;
    } else if (::isdigit(next_char)) {
      seen_written_exponent_digits = true;
      // Hex-floats express their exponent as decimal.
      int_type digit =
          static_cast<int_type>(static_cast<int_type>(next_char) - '0');
      if (written_exponent >= (written_exponent_overflow - digit) / 10) {
        // The exponent is very big. Saturate rather than overflow the exponent.
        // signed integer, which would be undefined behaviour.
        written_exponent = written_exponent_overflow;
      } else {
        written_exponent = static_cast<int_type>(
            static_cast<int_type>(written_exponent * 10) + digit);
      }
    } else {
      break;
    }
    is.get();
    next_char = is.peek();
  }
  if (!seen_written_exponent_digits) {
    // Binary exponent had no digits.
    is.setstate(std::ios::failbit);
    return is;
  }

  written_exponent = static_cast<int_type>(written_exponent * exponent_sign);
  // Now fold in the exponent bias into the written exponent, updating exponent.
  // But avoid undefined behaviour that would result from overflowing int_type.
  if (written_exponent >= 0 && exponent >= 0) {
    // Saturate up to written_exponent_overflow.
    if (written_exponent_overflow - exponent > written_exponent) {
      exponent = static_cast<int_type>(written_exponent + exponent);
    } else {
      exponent = written_exponent_overflow;
    }
  } else if (written_exponent < 0 && exponent < 0) {
    // Saturate down to -written_exponent_overflow.
    if (written_exponent_overflow + exponent > -written_exponent) {
      exponent = static_cast<int_type>(written_exponent + exponent);
    } else {
      exponent = static_cast<int_type>(-written_exponent_overflow);
    }
  } else {
    // They're of opposing sign, so it's safe to add.
    exponent = static_cast<int_type>(written_exponent + exponent);
  }

  bool is_zero = (!has_integer_part) && (fraction == 0);
  if ((!has_integer_part) && !is_zero) {
    fraction = static_cast<uint_type>(fraction << 1);
    exponent = static_cast<int_type>(exponent - 1);
  } else if (is_zero) {
    exponent = 0;
  }

  if (exponent <= 0 && !is_zero) {
    fraction = static_cast<uint_type>(fraction >> 1);
    fraction |= static_cast<uint_type>(1) << HF::top_bit_left_shift;
  }

  fraction = (fraction >> HF::fraction_right_shift) & HF::fraction_encode_mask;

  const int_type max_exponent =
      SetBits<uint_type, 0, HF::num_exponent_bits>::get;

  // Handle denorm numbers
  while (exponent < 0 && !is_zero) {
    fraction = static_cast<uint_type>(fraction >> 1);
    exponent = static_cast<int_type>(exponent + 1);

    fraction &= HF::fraction_encode_mask;
    if (fraction == 0) {
      // We have underflowed our fraction. We should clamp to zero.
      is_zero = true;
      exponent = 0;
    }
  }

  // We have overflowed so we should be inf/-inf.
  if (exponent > max_exponent) {
    exponent = max_exponent;
    fraction = 0;
  }

  uint_type output_bits = static_cast<uint_type>(
      static_cast<uint_type>(negate_value ? 1 : 0) << HF::top_bit_left_shift);
  output_bits |= fraction;

  uint_type shifted_exponent = static_cast<uint_type>(
      static_cast<uint_type>(exponent << HF::exponent_left_shift) &
      HF::exponent_mask);
  output_bits |= shifted_exponent;

  T output_float(output_bits);
  value.set_value(output_float);

  return is;
}